

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<float>
          (internal *this,char *expected_expression,char *actual_expression,float expected,
          float actual)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  stringstream local_390 [8];
  stringstream expected_ss;
  long local_380;
  undefined8 auStack_378 [13];
  ios_base aiStack_310 [264];
  stringstream local_208 [8];
  stringstream actual_ss;
  long local_1f8;
  undefined8 auStack_1f0 [13];
  ios_base aiStack_188 [264];
  string local_80;
  string local_60;
  FloatingPointUnion local_40;
  FloatingPointUnion local_3c;
  FloatingPoint<float> lhs;
  FloatingPoint<float> rhs;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_40.value_ = expected;
  local_3c.value_ = actual;
  lhs.u_ = (FloatingPointUnion)expected;
  bVar1 = FloatingPoint<float>::AlmostEquals
                    ((FloatingPoint<float> *)&local_40,(FloatingPoint<float> *)&local_3c);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_390);
    *(undefined8 *)((long)auStack_378 + *(long *)(local_380 + -0x18)) = 8;
    std::ostream::_M_insert<double>((double)(float)lhs.u_);
    std::__cxx11::stringstream::stringstream(local_208);
    *(undefined8 *)((long)auStack_1f0 + *(long *)(local_1f8 + -0x18)) = 8;
    std::ostream::_M_insert<double>((double)actual);
    StringStreamToString(&local_80,(stringstream *)local_390);
    StringStreamToString(&local_60,(stringstream *)local_208);
    EqFailure(this,expected_expression,actual_expression,&local_80,&local_60,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_208);
    std::ios_base::~ios_base(aiStack_188);
    std::__cxx11::stringstream::~stringstream(local_390);
    std::ios_base::~ios_base(aiStack_310);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* expected_expression,
                                         const char* actual_expression,
                                         RawType expected,
                                         RawType actual) {
  const FloatingPoint<RawType> lhs(expected), rhs(actual);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream expected_ss;
  expected_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
              << expected;

  ::std::stringstream actual_ss;
  actual_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
            << actual;

  return EqFailure(expected_expression,
                   actual_expression,
                   StringStreamToString(&expected_ss),
                   StringStreamToString(&actual_ss),
                   false);
}